

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmBlock * GetLoopContinueBlock(VmModule *module,uint depth)

{
  LoopInfo *pLVar1;
  uint index;
  uint i;
  uint uVar2;
  
  index = (module->loopInfo).count;
  for (uVar2 = 0; uVar2 != depth; uVar2 = uVar2 + 1) {
    do {
      index = index - 1;
      pLVar1 = SmallArray<VmModule::LoopInfo,_32U>::operator[](&module->loopInfo,index);
    } while (pLVar1->continueBlock == (VmBlock *)0x0);
  }
  pLVar1 = SmallArray<VmModule::LoopInfo,_32U>::operator[](&module->loopInfo,index);
  return pLVar1->continueBlock;
}

Assistant:

VmBlock* GetLoopContinueBlock(VmModule *module, unsigned depth)
{
	unsigned pos = module->loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!module->loopInfo[pos].continueBlock)
			pos--;
	}

	return module->loopInfo[pos].continueBlock;
}